

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeclaredType.cpp
# Opt level: O2

ASTContext * __thiscall
slang::ast::DeclaredType::getASTContext<false,slang::ast::ASTContext>
          (ASTContext *__return_storage_ptr__,DeclaredType *this)

{
  Symbol **ppSVar1;
  uint uVar2;
  ulong uVar3;
  SymbolIndex SVar4;
  Symbol *symbol;
  ulong uVar5;
  Scope *pSVar6;
  LookupLocation LVar7;
  
  uVar2 = (this->flags).m_bits;
  uVar3 = (ulong)(uVar2 >> 1 & 0x20);
  uVar5 = uVar3 + 0x40;
  if ((uVar2 & 0x10) != 0) {
    uVar5 = uVar3;
  }
  uVar5 = (ulong)(uVar2 & 0x800) << 0x19 |
          ((uVar2 & 0x80) << 0x14 | (uVar2 & 0x4000) << 0xb) | uVar5;
  symbol = this->parent;
  pSVar6 = symbol->parentScope;
  if (symbol->kind == Specparam) {
    uVar5 = (ulong)(pSVar6->thisSym->kind == SpecifyBlock) << 0x22 | uVar5 | 0x800000000;
  }
  if ((uVar2 & 8) == 0) {
    SVar4 = *(SymbolIndex *)&this->field_0x3c & 0x3fffffff;
    if (SVar4 != 0) goto LAB_00351e39;
  }
  else {
    ppSVar1 = &pSVar6->thisSym;
    symbol = (Symbol *)(*ppSVar1)[1].originatingSyntax;
    pSVar6 = symbol->parentScope;
    uVar5 = uVar5 | (ulong)((byte)(*ppSVar1)[2].name._M_len & 2) << 0x2b;
  }
  LVar7 = LookupLocation::before(symbol);
  SVar4 = LVar7.index;
LAB_00351e39:
  (__return_storage_ptr__->scope).ptr = pSVar6;
  __return_storage_ptr__->lookupIndex = SVar4;
  (__return_storage_ptr__->flags).m_bits = uVar5;
  __return_storage_ptr__->instanceOrProc = (Symbol *)0x0;
  __return_storage_ptr__->firstTempVar = (TempVarSymbol *)0x0;
  __return_storage_ptr__->randomizeDetails = (RandomizeDetails *)0x0;
  __return_storage_ptr__->assertionInstance = (AssertionInstanceDetails *)0x0;
  return __return_storage_ptr__;
}

Assistant:

T DeclaredType::getASTContext() const {
    bitmask<ASTFlags> astFlags;
    if (flags.has(DeclaredTypeFlags::NetType))
        astFlags |= ASTFlags::NonProcedural;
    if (!flags.has(DeclaredTypeFlags::AutomaticInitializer))
        astFlags |= ASTFlags::StaticInitializer;
    if (flags.has(DeclaredTypeFlags::CoverageType))
        astFlags |= ASTFlags::AllowCoverageSampleFormal;
    if (flags.has(DeclaredTypeFlags::UserDefinedNetType))
        astFlags |= ASTFlags::AllowNetType;
    if (flags.has(DeclaredTypeFlags::DPIArg))
        astFlags |= ASTFlags::DPIArg;

    const Scope* scope = parent.getParentScope();
    SLANG_ASSERT(scope);

    // Specparams inside of specify blocks have additional constraints so we
    // need to set the AST flag for them.
    if (parent.kind == SymbolKind::Specparam) {
        astFlags |= ASTFlags::SpecparamInitializer;
        if (scope->asSymbol().kind == SymbolKind::SpecifyBlock)
            astFlags |= ASTFlags::SpecifyBlock;
    }

    // If this type/initializer has been overridden by a parameter override,
    // we should use the instantiation scope and not the parameter's scope
    // when resolving.
    if ((IsInitializer && flags.has(DeclaredTypeFlags::InitializerOverridden)) ||
        (!IsInitializer && flags.has(DeclaredTypeFlags::TypeOverridden))) {
        auto& instBody = scope->asSymbol().as<InstanceBodySymbol>();
        auto inst = instBody.parentInstance;
        SLANG_ASSERT(inst);

        scope = inst->getParentScope();
        SLANG_ASSERT(scope);

        if (instBody.flags.has(InstanceFlags::FromBind))
            astFlags |= ASTFlags::BindInstantiation;

        return ASTContext(*scope, LookupLocation::before(*inst), astFlags);
    }

    // The location depends on whether we are creating the initializer or the type.
    // Initializer lookup happens *after* the parent symbol, so that it can reference
    // the symbol itself. Type lookup happens *before*, since it can't yet see the
    // symbol declaration. There is an exception for parameters, which also can't
    // see its own declaration (which would result in infinite recursion).
    LookupLocation location;
    if (overrideIndex) {
        location = LookupLocation(parent.getParentScope(), overrideIndex);
    }
    else if (IsInitializer) {
        if (flags.has(DeclaredTypeFlags::InitializerCantSeeParent))
            location = LookupLocation::before(parent);
        else
            location = LookupLocation::after(parent);
    }
    else {
        location = LookupLocation::before(parent);
    }

    return ASTContext(*scope, location, astFlags);
}